

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

void __thiscall CKey::MakeNewKey(CKey *this,bool fCompressedIn)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MakeKeyData(this);
  do {
    bytes.m_size = 0x20;
    bytes.m_data = ((this->keydata)._M_t.
                    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)->
                   _M_elems;
    GetStrongRandBytes(bytes);
    iVar2 = secp256k1_ec_seckey_verify
                      (secp256k1_context_sign,
                       ((this->keydata)._M_t.
                        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                       _M_head_impl)->_M_elems);
  } while (iVar2 == 0);
  this->fCompressed = fCompressedIn;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CKey::MakeNewKey(bool fCompressedIn) {
    MakeKeyData();
    do {
        GetStrongRandBytes(*keydata);
    } while (!Check(keydata->data()));
    fCompressed = fCompressedIn;
}